

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O3

int parse_jobs(pmtr_t *cfg,UT_string *em)

{
  UT_array *pUVar1;
  code *pcVar2;
  pmtr_t *ppVar3;
  int iVar4;
  uint *__ptr;
  void *yyp;
  char *pcVar5;
  void *__ptr_00;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  size_t toklen;
  size_t len;
  parse_t ps;
  char *buf;
  job_t job;
  uint local_2ac;
  size_t local_2a0;
  size_t local_298;
  char *local_290;
  parse_t local_288;
  pmtr_t *local_268;
  char *local_260;
  UT_string *local_258;
  char *local_250;
  job_t local_248;
  
  __ptr = (uint *)calloc(1,0x30);
  *(size_t *)(__ptr + 2) = 8;
  *(undefined1 **)(__ptr + 4) = (undefined1 *)0x0;
  *(code **)(__ptr + 6) = utarray_str_cpy;
  *(code **)(__ptr + 8) = utarray_str_dtor;
  uVar8 = 0;
  memset(&local_248,0,0x198);
  local_248.cmdv.icd.sz = 8;
  local_248.cmdv.icd.init = (undefined1 *)0x0;
  local_248.cmdv.icd.copy = utarray_str_cpy;
  local_248.cmdv.icd.dtor = utarray_str_dtor;
  local_248.envv.d = (char *)0x0;
  local_248.envv.i = 0;
  local_248.envv.n = 0;
  local_248.envv.icd.copy = utarray_str_cpy;
  local_248.envv.icd.dtor = utarray_str_dtor;
  local_248.envv.icd.sz = 8;
  local_248.envv.icd.init = (undefined1 *)0x0;
  local_248.depv.d = (char *)0x0;
  local_248.depv.i = 0;
  local_248.depv.n = 0;
  local_248.depv.icd.copy = utarray_str_cpy;
  local_248.depv.icd.dtor = utarray_str_dtor;
  local_248.depv.icd.sz = 8;
  local_248.depv.icd.init = (undefined1 *)0x0;
  local_248.rlim.d = (char *)0x0;
  local_248.rlim.i = 0;
  local_248.rlim.n = 0;
  local_248.rlim.icd.copy = (ctor_f *)0x0;
  local_248.rlim.icd.dtor = (undefined1 *)0x0;
  local_248.rlim.icd.sz = 0x18;
  local_248.rlim.icd.init = (undefined1 *)0x0;
  local_248.cpuset.__bits[0xe] = 0;
  local_248.cpuset.__bits[0xf] = 0;
  local_248.cpuset.__bits[0xc] = 0;
  local_248.cpuset.__bits[0xd] = 0;
  local_248.cpuset.__bits[10] = 0;
  local_248.cpuset.__bits[0xb] = 0;
  local_248.cpuset.__bits[8] = 0;
  local_248.cpuset.__bits[9] = 0;
  local_248.cpuset.__bits[6] = 0;
  local_248.cpuset.__bits[7] = 0;
  local_248.cpuset.__bits[4] = 0;
  local_248.cpuset.__bits[5] = 0;
  local_248.cpuset.__bits[2] = 0;
  local_248.cpuset.__bits[3] = 0;
  local_248.cpuset.__bits[0] = 0;
  local_248.cpuset.__bits[1] = 0;
  local_248.respawn = 1;
  local_288.line = 1;
  local_288.rc = 0;
  local_288.em = em;
  local_288.job = &local_248;
  local_288.cfg = cfg;
  yyp = ParseAlloc(malloc);
  local_268 = cfg;
  iVar4 = slurp(cfg->file,&local_260,&local_298);
  if (iVar4 < 0) {
    local_288.rc = -1;
  }
  else {
    local_290 = local_260;
    local_250 = local_260;
    local_2ac = get_tok(local_260,&local_290,&local_298,&local_2a0,&local_288.line);
    if ((int)local_2ac < 1) {
      __ptr_00 = (void *)0x0;
      uVar10 = 0;
    }
    else {
      __ptr_00 = (void *)0x0;
      uVar10 = 0;
      uVar9 = 0;
      local_258 = em;
      do {
        pcVar5 = strndup(local_290,local_2a0);
        uVar8 = uVar9 + 1;
        uVar7 = (uint)uVar8;
        if (uVar10 < uVar7) {
          do {
            bVar11 = uVar10 == 0;
            uVar10 = uVar10 * 2;
            if (bVar11) {
              uVar10 = 8;
            }
          } while (uVar10 < uVar7);
          __ptr_00 = realloc(__ptr_00,(ulong)uVar10 << 3);
          *(void **)(__ptr + 10) = __ptr_00;
          if (__ptr_00 == (void *)0x0) {
            exit(-1);
          }
        }
        if (pcVar5 == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          pcVar6 = strdup(pcVar5);
        }
        *(char **)((long)__ptr_00 + uVar9 * 8) = pcVar6;
        __ptr_00 = *(void **)(__ptr + 10);
        free(pcVar5);
        pcVar5 = *(char **)((long)__ptr_00 + uVar9 * 8);
        if (1 < local_268->verbose) {
          printf("token [%s] id=%d line=%d\n",pcVar5,(ulong)local_2ac,(ulong)(uint)local_288.line);
        }
        Parse(yyp,local_2ac,pcVar5,&local_288);
        if (local_288.rc == -1) {
          *__ptr = uVar7;
          __ptr[1] = uVar10;
          goto LAB_00105086;
        }
        local_298 = local_298 - local_2a0;
        local_290 = local_290 + local_2a0;
        local_2ac = get_tok(local_250,&local_290,&local_298,&local_2a0,&local_288.line);
        uVar9 = uVar8;
      } while (0 < (int)local_2ac);
      *__ptr = uVar7;
      __ptr[1] = uVar10;
      em = local_258;
    }
    if (local_2ac == 0xffffffff) {
      utstring_printf(em,"syntax error in %s line %d",(local_288.cfg)->file,
                      (ulong)(uint)local_288.line);
      local_288.rc = -1;
    }
    else {
      Parse(yyp,0,(char *)0x0,&local_288);
      ppVar3 = local_268;
      if (local_288.rc != -1) {
        pUVar1 = local_268->jobs;
        qsort(pUVar1->d,(ulong)pUVar1->i,(pUVar1->icd).sz,order_sort);
        hash_deps(ppVar3->jobs);
      }
    }
LAB_00105086:
    if (uVar10 != 0) {
      pcVar2 = *(code **)(__ptr + 8);
      if ((pcVar2 != (code *)0x0) && ((int)uVar8 != 0)) {
        uVar8 = uVar8 & 0xffffffff;
        do {
          (*pcVar2)(__ptr_00);
          __ptr_00 = (void *)((long)__ptr_00 + 8);
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        __ptr_00 = *(void **)(__ptr + 10);
      }
      free(__ptr_00);
    }
  }
  free(__ptr);
  ParseFree(yyp,free);
  if (local_260 != (char *)0x0) {
    free(local_260);
  }
  job_fin(&local_248);
  return local_288.rc;
}

Assistant:

int parse_jobs(pmtr_t *cfg, UT_string *em) {
  char *buf, *c, *tok;
  size_t len,toklen;
  UT_array *toks;
  parse_t ps; /* our own parser state */ 
  void *p;    /* lemon parser */
  int id;

  utarray_new(toks,&ut_str_icd);
  job_t job;  /* "scratch" space used when parsing a job */
  job_ini(&job);
  ps.job=&job; 

  ps.cfg=cfg;
  ps.line=1; 
  ps.em=em;
  ps.rc=0;

  p = ParseAlloc(malloc);

  if (slurp(ps.cfg->file, &buf, &len) < 0) {ps.rc=-1; goto done;}
  c = buf;
  while ( (id=get_tok(buf,&c,&len,&toklen,&ps.line)) > 0) {
    tok = strndup(c,toklen); utarray_push_back(toks,&tok); free(tok); 
    tok = *(char**)utarray_back(toks);
    if (cfg->verbose >=2) printf("token [%s] id=%d line=%d\n",tok, id, ps.line);
    Parse(p, id, tok, &ps);
    if (ps.rc == -1) goto done;
    len -= toklen;
    c += toklen;
  }
  if (id == -1) {
    utstring_printf(em,"syntax error in %s line %d", ps.cfg->file, ps.line);
    ps.rc = -1;
    goto done;
  }
  Parse(p, 0, NULL, &ps);
  if (ps.rc == -1) goto done;

  /* parsing succeeded */
  utarray_sort(cfg->jobs, order_sort);
  hash_deps(cfg->jobs);

 done:
  utarray_free(toks);
  ParseFree(p, free);
  if (buf) free(buf);
  job_fin(&job);
  return ps.rc;
}